

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebAssemblyInstance.cpp
# Opt level: O2

void Js::WebAssemblyInstance::InitialGlobals
               (WebAssemblyModule *wasmModule,ScriptContext *ctx,WebAssemblyEnvironment *env)

{
  uint32 uVar1;
  uint32 index;
  WasmGlobal *this;
  WasmGlobal *global;
  int32 hCode;
  uint32 index_00;
  anon_union_16_5_ffed0461_for_WasmConstLitNode_0 cnst;
  
  uVar1 = WebAssemblyModule::GetGlobalCount(wasmModule);
  index_00 = 0;
  do {
    if (uVar1 == index_00) {
      return;
    }
    this = WebAssemblyModule::GetGlobal(wasmModule,index_00);
    if (this->m_rType != ImportedReference) {
      if (this->m_rType == LocalReference) {
        index = Wasm::WasmGlobal::GetGlobalIndexInit(this);
        global = WebAssemblyModule::GetGlobal(wasmModule,index);
        if ((global->m_rType | LocalReference) != ImportedReference) {
          hCode = -0x7ff5e4a1;
LAB_00c19849:
          JavascriptError::ThrowTypeError(ctx,hCode,(PCWSTR)0x0);
        }
        if (global->m_type != this->m_type) {
          hCode = -0x7ff5e49f;
          goto LAB_00c19849;
        }
        cnst = (anon_union_16_5_ffed0461_for_WasmConstLitNode_0)
               WebAssemblyEnvironment::GetGlobalValue(env,global);
      }
      else {
        cnst = (anon_union_16_5_ffed0461_for_WasmConstLitNode_0)Wasm::WasmGlobal::GetConstInit(this)
        ;
      }
      WebAssemblyEnvironment::SetGlobalValue(env,this,(WasmConstLitNode)cnst);
    }
    index_00 = index_00 + 1;
  } while( true );
}

Assistant:

void WebAssemblyInstance::InitialGlobals(WebAssemblyModule * wasmModule, ScriptContext* ctx, WebAssemblyEnvironment* env)
{
    uint count = wasmModule->GetGlobalCount();
    for (uint i = 0; i < count; i++)
    {
        Wasm::WasmGlobal* global = wasmModule->GetGlobal(i);
        Wasm::WasmConstLitNode cnst = {};

        if (global->GetReferenceType() == Wasm::GlobalReferenceTypes::ImportedReference)
        {
            // the value should already be resolved
            continue;
        }

        if (global->GetReferenceType() == Wasm::GlobalReferenceTypes::LocalReference)
        {
            Wasm::WasmGlobal* sourceGlobal = wasmModule->GetGlobal(global->GetGlobalIndexInit());
            if (sourceGlobal->GetReferenceType() != Wasm::GlobalReferenceTypes::Const &&
                sourceGlobal->GetReferenceType() != Wasm::GlobalReferenceTypes::ImportedReference)
            {
                JavascriptError::ThrowTypeError(ctx, WASMERR_InvalidGlobalRef);
            }

            if (sourceGlobal->GetType() != global->GetType())
            {
                JavascriptError::ThrowTypeError(ctx, WASMERR_InvalidTypeConversion);
            }
            cnst = env->GetGlobalValue(sourceGlobal);
        }
        else
        {
            cnst = global->GetConstInit();
        }

        env->SetGlobalValue(global, cnst);
    }
}